

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_test.cc
# Opt level: O2

void __thiscall
cpsm::testing::Matches::assert_match_index(Matches *this,string_ref item,size_type expected_index)

{
  size_type args_3;
  TestAssertionFailure *this_00;
  
  args_3 = match_index(this,item);
  if (args_3 == expected_index) {
    return;
  }
  this_00 = (TestAssertionFailure *)__cxa_allocate_exception(0x28);
  TestAssertionFailure::
  TestAssertionFailure<char_const*,boost::basic_string_ref<char,std::char_traits<char>>,char_const*,unsigned_long,char_const*,unsigned_long>
            (this_00,"expected \'",item,"\' (index ",args_3,") to have index ",expected_index);
  __cxa_throw(this_00,&TestAssertionFailure::typeinfo,TestAssertionFailure::~TestAssertionFailure,
              expected_index);
}

Assistant:

void assert_match_index(boost::string_ref const item,
                          size_type const expected_index) const {
    auto const index = match_index(item);
    if (index != expected_index) {
      throw TestAssertionFailure("expected '", item, "' (index ", index,
                                 ") to have index ", expected_index);
    }
  }